

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void argo::unparser::unparse
               (ostream *o,json *j,char *space,char *newline,char *indent,int indent_inc)

{
  stream_writer w;
  unparser u;
  stream_writer sStack_68;
  unparser local_58;
  
  stream_writer::stream_writer(&sStack_68,o);
  local_58.m_writer = &sStack_68.super_writer;
  local_58.m_space = space;
  local_58.m_newline = newline;
  local_58.m_indent = indent;
  local_58.m_indent_inc = indent_inc;
  unparse(&local_58,j,0);
  return;
}

Assistant:

void unparser::unparse(
        ostream    &o,
        const json &j,
        const char *space,
        const char *newline,
        const char *indent,
        int        indent_inc)
{
    stream_writer w(&o);
    unparser u(w, space, newline, indent, indent_inc);
    u.unparse(j, 0);
}